

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O3

void __thiscall
CaDiCaL::LratChecker::conclude_unsat
          (LratChecker *this,ConclusionType conclusion,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *ids)

{
  uint *puVar1;
  LratCheckerClause **ppLVar2;
  pointer puVar3;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var4;
  pointer puVar5;
  char *this_00;
  uint *puVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range4;
  
  if (this->concluded == true) {
    conclude_unsat();
  }
  this->concluded = true;
  if (conclusion == ASSUMPTIONS) {
    puVar3 = (ids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (((long)puVar3 -
         (long)(ids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start != 8) ||
       (puVar5 = (this->assumption_clauses).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish,
       (long)puVar5 -
       (long)(this->assumption_clauses).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start != 8)) {
      fatal_message_start();
      fputs("expected exactly one assumption clause\n",_stderr);
      fatal_message_end();
      puVar3 = (ids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      puVar5 = (this->assumption_clauses).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    if (puVar3[-1] == puVar5[-1]) {
      return;
    }
    this_00 = "conclusion is not an assumption clause\n";
  }
  else {
    if (conclusion != CONFLICT) {
      puVar3 = (ids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = (ids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if ((long)(this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 != (long)puVar5 - (long)puVar3 >> 3) {
        fatal_message_start();
        fputs("not complete conclusion given for constraint\n",_stderr);
        fputs("The constraint contains the literals: ",_stderr);
        puVar1 = (uint *)(this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
        for (puVar6 = (uint *)(this->constraint).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1;
            puVar6 = puVar6 + 1) {
          fprintf(_stderr,"%d ",(ulong)*puVar6);
        }
        fputs("\nThe ids are: ",_stderr);
        puVar5 = (ids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (puVar3 = (ids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar5;
            puVar3 = puVar3 + 1) {
          fprintf(_stderr,"%lu ",*puVar3);
        }
        fatal_message_end();
        puVar3 = (ids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar5 = (ids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      for (; puVar3 != puVar5; puVar3 = puVar3 + 1) {
        _Var4 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                          ((this->assumption_clauses).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,
                           (this->assumption_clauses).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish,puVar3);
        if (_Var4._M_current ==
            (this->assumption_clauses).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          conclude_unsat();
        }
      }
      return;
    }
    ppLVar2 = find(this,(ids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data._M_finish[-1]);
    this_00 = "empty clause not in proof\n";
    if ((*ppLVar2 != (LratCheckerClause *)0x0) && ((*ppLVar2)->size == 0)) {
      return;
    }
  }
  conclude_unsat((LratChecker *)this_00);
  return;
}

Assistant:

void LratChecker::conclude_unsat (ConclusionType conclusion,
                                  const vector<uint64_t> &ids) {
  if (concluded) {
    fatal_message_start ();
    fputs ("already concluded\n", stderr);
    fatal_message_end ();
  }
  concluded = true;
  if (conclusion == CONFLICT) {
    LratCheckerClause **p = find (ids.back ()), *d = *p;
    if (!d || d->size) {
      fatal_message_start ();
      fputs ("empty clause not in proof\n", stderr);
      fatal_message_end ();
    }
    return;
  } else if (conclusion == ASSUMPTIONS) {
    if (ids.size () != 1 || assumption_clauses.size () != 1) {
      fatal_message_start ();
      fputs ("expected exactly one assumption clause\n", stderr);
      fatal_message_end ();
    }
    if (ids.back () != assumption_clauses.back ()) {
      fatal_message_start ();
      fputs ("conclusion is not an assumption clause\n", stderr);
      fatal_message_end ();
    }
    return;
  } else {
    assert (conclusion == CONSTRAINT);
    if (constraint.size () != ids.size ()) {
      fatal_message_start ();
      fputs ("not complete conclusion given for constraint\n", stderr);
      fputs ("The constraint contains the literals: ", stderr);
      for (auto c : constraint) {
        fprintf (stderr, "%d ", c);
      }

      fputs ("\nThe ids are: ", stderr);
      for (auto c : ids) {
        fprintf (stderr, "%" PRIu64 " ", c);
      }
      fatal_message_end ();
    }
    for (auto &id : ids) {
      if (std::find (assumption_clauses.begin (), assumption_clauses.end (),
                     id) != assumption_clauses.end ())
        continue;
      fatal_message_start ();
      fputs ("assumption clause for constraint missing\n", stderr);
      fatal_message_end ();
    }
  }
}